

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinstatsindex.cpp
# Opt level: O0

optional<kernel::CCoinsStats> * __thiscall
CoinStatsIndex::LookUpStats(CoinStatsIndex *this,CBlockIndex *block_index)

{
  long lVar1;
  bool bVar2;
  CDBWrapper *db;
  long in_RDX;
  BlockRef *in_RSI;
  CCoinsStats *in_RDI;
  long in_FS_OFFSET;
  DBVal entry;
  CCoinsStats stats;
  DBVal *in_stack_fffffffffffffe08;
  CCoinsStats *this_00;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *(undefined4 *)(in_RDX + 0x18);
  this_00 = in_RDI;
  CBlockIndex::GetBlockHash((CBlockIndex *)in_RDI);
  kernel::CCoinsStats::CCoinsStats
            ((CCoinsStats *)CONCAT44(uVar3,in_stack_fffffffffffffe20),(int)((ulong)this_00 >> 0x20),
             (uint256 *)in_RDI);
  anon_unknown.dwarf_193474c::DBVal::DBVal(in_stack_fffffffffffffe08);
  db = &std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator*
                  ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)this_00)->
        super_CDBWrapper;
  CBlockIndex::GetBlockHash((CBlockIndex *)this_00);
  bVar2 = LookUpOne(db,in_RSI,(DBVal *)CONCAT44(uVar3,in_stack_fffffffffffffe20));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::optional<long>::optional<long_&,_true>((optional<long> *)this_00,(long *)in_RDI);
    std::optional<kernel::CCoinsStats>::optional<kernel::CCoinsStats,_true>
              ((optional<kernel::CCoinsStats> *)this_00,in_RDI);
  }
  else {
    std::optional<kernel::CCoinsStats>::optional((optional<kernel::CCoinsStats> *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<kernel::CCoinsStats> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<CCoinsStats> CoinStatsIndex::LookUpStats(const CBlockIndex& block_index) const
{
    CCoinsStats stats{block_index.nHeight, block_index.GetBlockHash()};
    stats.index_used = true;

    DBVal entry;
    if (!LookUpOne(*m_db, {block_index.GetBlockHash(), block_index.nHeight}, entry)) {
        return std::nullopt;
    }

    stats.hashSerialized = entry.muhash;
    stats.nTransactionOutputs = entry.transaction_output_count;
    stats.nBogoSize = entry.bogo_size;
    stats.total_amount = entry.total_amount;
    stats.total_subsidy = entry.total_subsidy;
    stats.total_unspendable_amount = entry.total_unspendable_amount;
    stats.total_prevout_spent_amount = entry.total_prevout_spent_amount;
    stats.total_new_outputs_ex_coinbase_amount = entry.total_new_outputs_ex_coinbase_amount;
    stats.total_coinbase_amount = entry.total_coinbase_amount;
    stats.total_unspendables_genesis_block = entry.total_unspendables_genesis_block;
    stats.total_unspendables_bip30 = entry.total_unspendables_bip30;
    stats.total_unspendables_scripts = entry.total_unspendables_scripts;
    stats.total_unspendables_unclaimed_rewards = entry.total_unspendables_unclaimed_rewards;

    return stats;
}